

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3WindowLink(Select *pSel,Window *pWin)

{
  Window **ppWVar1;
  byte *pbVar2;
  Window *pWVar3;
  int iVar4;
  
  if (pSel != (Select *)0x0) {
    ppWVar1 = &pSel->pWin;
    if ((pSel->pWin == (Window *)0x0) ||
       (iVar4 = sqlite3WindowCompare((Parse *)0x0,pSel->pWin,pWin,0), iVar4 == 0)) {
      pWVar3 = *ppWVar1;
      pWin->pNextWin = pWVar3;
      if (pWVar3 != (Window *)0x0) {
        pWVar3->ppThis = &pWin->pNextWin;
      }
      *ppWVar1 = pWin;
      pWin->ppThis = ppWVar1;
    }
    else {
      iVar4 = sqlite3ExprListCompare(pWin->pPartition,(*ppWVar1)->pPartition,-1);
      if (iVar4 != 0) {
        pbVar2 = (byte *)((long)&pSel->selFlags + 3);
        *pbVar2 = *pbVar2 | 2;
      }
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3WindowLink(Select *pSel, Window *pWin){
  if( pSel ){
    if( 0==pSel->pWin || 0==sqlite3WindowCompare(0, pSel->pWin, pWin, 0) ){
      pWin->pNextWin = pSel->pWin;
      if( pSel->pWin ){
        pSel->pWin->ppThis = &pWin->pNextWin;
      }
      pSel->pWin = pWin;
      pWin->ppThis = &pSel->pWin;
    }else{
      if( sqlite3ExprListCompare(pWin->pPartition, pSel->pWin->pPartition,-1) ){
        pSel->selFlags |= SF_MultiPart;
      }
    }
  }
}